

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportMemoryCounter
            (accum,"Memory/Measured BRDF data",*(int64_t *)(in_FS_OFFSET + -0x110));
  *(undefined8 *)(in_FS_OFFSET + -0x110) = 0;
  return;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}